

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GetErrorCase::iterate(GetErrorCase *this)

{
  ResultCollector *results;
  FuncType FVar1;
  Context *pCVar2;
  CoreTestFunc p_Var3;
  DebugMessageTestContext context;
  NegativeTestContext local_60;
  GetErrorCase *local_20;
  
  pCVar2 = (this->super_BaseCase).super_ErrorCase.super_TestCase.m_context;
  results = &(this->super_BaseCase).m_results;
  NegativeTestShared::NegativeTestContext::NegativeTestContext
            (&local_60,(ErrorCase *)this,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
             ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log,results,true);
  FVar1 = (this->m_errorFunc).m_type;
  p_Var3 = (this->m_errorFunc).m_func.coreFn;
  local_20 = this;
  if (FVar1 == TYPE_DEBUG) {
    (*p_Var3)(&local_60);
  }
  else if (FVar1 == TYPE_CORE) {
    (*p_Var3)(&local_60);
  }
  tcu::ResultCollector::setTestContextResult
            (results,(this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx);
  NegativeTestShared::NegativeTestContext::~NegativeTestContext(&local_60);
  return STOP;
}

Assistant:

GetErrorCase::IterateResult GetErrorCase::iterate (void)
{
	tcu::TestLog&			log		= m_testCtx.getLog();
	DebugMessageTestContext	context	= DebugMessageTestContext(*this, m_context.getRenderContext(), m_context.getContextInfo(), log, m_results, true);

	m_errorFunc.call(context);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}